

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O1

vocwdef * vocffw(voccxdef *ctx,char *wrd,int len,char *wrd2,int len2,int p,vocseadef *search_ctx)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  vocwdef *pvVar5;
  vocdef *pvVar6;
  vocdef *pvVar7;
  vocwdef *local_38;
  
  uVar2 = vochsh((uchar *)wrd,len);
  pvVar7 = ctx->voccxhsh[uVar2];
  if (pvVar7 == (vocdef *)0x0) {
    pvVar6 = (vocdef *)0x0;
    local_38 = (vocwdef *)0x0;
  }
  else {
    do {
      bVar1 = pvVar7->voclen;
      iVar3 = voceq((uchar *)wrd,len,pvVar7->voctxt,(uint)bVar1);
      if ((iVar3 == 0) ||
         (iVar3 = voceq((uchar *)wrd2,len2,pvVar7->voctxt + bVar1,(uint)pvVar7->vocln2), iVar3 == 0)
         ) {
LAB_001f4c5c:
        pvVar6 = (vocdef *)0x0;
        pvVar5 = local_38;
      }
      else {
        uVar4 = pvVar7->vocwlst;
        while( true ) {
          if (uVar4 == 0xffffffff) {
            pvVar5 = (vocwdef *)0x0;
          }
          else {
            pvVar5 = (vocwdef *)
                     ((long)&ctx->voccxwp[(ulong)uVar4 / 2000]->vocwnxt +
                     (ulong)((uVar4 % 2000) * 8));
          }
          if (pvVar5 == (vocwdef *)0x0) goto LAB_001f4c5c;
          if (((uint)pvVar5->vocwtyp == p) && (pvVar6 = pvVar7, (pvVar5->vocwflg & 9) == 0)) break;
          uVar4 = pvVar5->vocwnxt;
        }
      }
      local_38 = pvVar5;
    } while ((pvVar6 == (vocdef *)0x0) && (pvVar7 = pvVar7->vocnxt, pvVar7 != (vocdef *)0x0));
    if (pvVar6 == (vocdef *)0x0) {
      local_38 = (vocwdef *)0x0;
    }
  }
  if (search_ctx != (vocseadef *)0x0) {
    search_ctx->v = pvVar6;
    search_ctx->vw = local_38;
    search_ctx->wrd1 = (uchar *)wrd;
    search_ctx->len1 = len;
    search_ctx->wrd2 = (uchar *)wrd2;
    search_ctx->len2 = len2;
  }
  return local_38;
}

Assistant:

vocwdef *vocffw(voccxdef *ctx, char *wrd, int len, char *wrd2, int len2,
                int p, vocseadef *search_ctx)
{
    uint     hshval;
    vocdef  *v, *vf;
    vocwdef *vw, *vwf;

    /* get the word's hash value */
    hshval = vochsh((uchar *)wrd, len);

    /* scan the hash list until we run out of entries, or find a match */
    for (v = ctx->voccxhsh[hshval], vf = 0 ; v != 0 && vf == 0 ;
         v = v->vocnxt)
    {
        /* if this word matches, look at the objects in its list */
        if (voceq((uchar *)wrd, len, v->voctxt, v->voclen)
            && voceq((uchar *)wrd2, len2, v->voctxt + v->voclen, v->vocln2))
        {
            /* look for a suitable object in the vocwdef list */
            for (vw = vocwget(ctx, v->vocwlst) ; vw ;
                 vw = vocwget(ctx, vw->vocwnxt))
            {
                if (vw->vocwtyp == p && !(vw->vocwflg & VOCFCLASS)
                    && !(vw->vocwflg & VOCFDEL))
                {
                    /*
                     *   remember the first vocdef that we found, and
                     *   remember this, the first matching vocwdef; then
                     *   stop scanning, since we have a match 
                     */
                    vf = v;
                    vwf = vw;
                    break;
                }
            }
        }
    }

    /* set up the caller-provided search structure for next time */
    vw = (vf != 0 ? vwf : 0);
    if (search_ctx)
    {
        /* save the search position */
        search_ctx->v = vf;
        search_ctx->vw = vw;

        /* save the search criteria */
        search_ctx->wrd1 = (uchar *)wrd;
        search_ctx->len1 = len;
        search_ctx->wrd2 = (uchar *)wrd2;
        search_ctx->len2 = len2;
    }

    /* return the match */
    return vw;
}